

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

ostream * argparse::operator<<(ostream *stream,Argument *argument)

{
  pointer pbVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  undefined8 uVar3;
  bool bVar4;
  size_type sVar5;
  ostream *poVar6;
  char *pcVar7;
  string *in_R8;
  size_type __pos;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  allocator<char> local_209;
  string_view help_view;
  string name_padding;
  stringstream name_stream;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&name_stream);
  poVar6 = local_1a8;
  std::operator<<(poVar6,"  ");
  pbVar1 = (argument->m_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  name._M_str = (pbVar1->_M_dataplus)._M_p;
  name._M_len = pbVar1->_M_string_length;
  bVar4 = Argument::is_positional(name,argument->m_prefix_chars);
  if (bVar4) {
    if ((argument->m_metavar)._M_string_length == 0) {
      pbVar1 = (argument->m_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var2._M_current =
           (argument->m_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::string<std::allocator<char>>((string *)&help_view," ",&local_209);
      details::
      join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&name_padding,(details *)pbVar1,_Var2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_view,
                 in_R8);
      std::operator<<(poVar6,(string *)&name_padding);
      std::__cxx11::string::~string((string *)&name_padding);
      std::__cxx11::string::~string((string *)&help_view);
    }
    else {
LAB_0011ce95:
      std::operator<<(poVar6,(string *)&argument->m_metavar);
    }
  }
  else {
    pbVar1 = (argument->m_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var2._M_current =
         (argument->m_names).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::string<std::allocator<char>>((string *)&help_view,", ",&local_209);
    details::
    join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&name_padding,(details *)pbVar1,_Var2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_view,in_R8
              );
    std::operator<<(poVar6,(string *)&name_padding);
    std::__cxx11::string::~string((string *)&name_padding);
    std::__cxx11::string::~string((string *)&help_view);
    if ((((argument->m_metavar)._M_string_length != 0) && ((argument->m_num_args_range).m_min == 1))
       && ((argument->m_num_args_range).m_max == 1)) {
      poVar6 = std::operator<<(poVar6," ");
      goto LAB_0011ce95;
    }
  }
  uVar3 = *(undefined8 *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10);
  std::__cxx11::stringbuf::str();
  name_padding._M_dataplus._M_p = (pointer)&name_padding.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&name_padding,(size_type)help_view._M_str,' ');
  std::__cxx11::string::~string((string *)&help_view);
  std::__cxx11::stringbuf::str();
  std::operator<<(stream,(string *)&help_view);
  std::__cxx11::string::~string((string *)&help_view);
  help_view._M_str = (argument->m_help)._M_dataplus._M_p;
  help_view._M_len = (argument->m_help)._M_string_length;
  bVar4 = true;
  __pos = 0;
  while( true ) {
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&argument->m_help,'\n',__pos);
    if (sVar5 == 0xffffffffffffffff) break;
    bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&help_view,__pos,(sVar5 - __pos) + 1);
    if (bVar4) {
      poVar6 = std::operator<<(stream,"  ");
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,bVar8._M_str,bVar8._M_len);
      bVar4 = false;
    }
    else {
      *(undefined8 *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = uVar3;
      poVar6 = std::operator<<(stream,(string *)&name_padding);
      poVar6 = std::operator<<(poVar6,"  ");
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,bVar8._M_str,bVar8._M_len);
    }
    __pos = sVar5 + 1;
  }
  if (bVar4) {
    poVar6 = std::operator<<(stream,"  ");
    std::operator<<(poVar6,(string *)&argument->m_help);
  }
  else {
    bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&help_view,__pos,(argument->m_help)._M_string_length - __pos);
    if (bVar8._M_len != 0) {
      *(undefined8 *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = uVar3;
      poVar6 = std::operator<<(stream,(string *)&name_padding);
      poVar6 = std::operator<<(poVar6,"  ");
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,bVar8._M_str,bVar8._M_len);
    }
  }
  if ((argument->m_help)._M_string_length != 0) {
    std::operator<<(stream," ");
  }
  operator<<(stream,&argument->m_num_args_range);
  if (((argument->m_default_value)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) ||
     ((argument->m_num_args_range).m_max == 0 && (argument->m_num_args_range).m_min == 0)) {
    if ((argument->field_0x140 & 4) == 0) goto LAB_0011d0d7;
    pcVar7 = "[required]";
    poVar6 = stream;
  }
  else {
    poVar6 = std::operator<<(stream,"[default: ");
    poVar6 = std::operator<<(poVar6,(string *)&argument->m_default_value_repr);
    pcVar7 = "]";
  }
  std::operator<<(poVar6,pcVar7);
LAB_0011d0d7:
  std::operator<<(stream,"\n");
  std::__cxx11::string::~string((string *)&name_padding);
  std::__cxx11::stringstream::~stringstream((stringstream *)&name_stream);
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream,
                                  const Argument &argument) {
    std::stringstream name_stream;
    name_stream << "  "; // indent
    if (argument.is_positional(argument.m_names.front(),
                               argument.m_prefix_chars)) {
      if (!argument.m_metavar.empty()) {
        name_stream << argument.m_metavar;
      } else {
        name_stream << details::join(argument.m_names.begin(),
                                     argument.m_names.end(), " ");
      }
    } else {
      name_stream << details::join(argument.m_names.begin(),
                                   argument.m_names.end(), ", ");
      // If we have a metavar, and one narg - print the metavar
      if (!argument.m_metavar.empty() &&
          argument.m_num_args_range == NArgsRange{1, 1}) {
        name_stream << " " << argument.m_metavar;
      }
    }

    // align multiline help message
    auto stream_width = stream.width();
    auto name_padding = std::string(name_stream.str().size(), ' ');
    auto pos = std::string::size_type{};
    auto prev = std::string::size_type{};
    auto first_line = true;
    auto hspace = "  "; // minimal space between name and help message
    stream << name_stream.str();
    std::string_view help_view(argument.m_help);
    while ((pos = argument.m_help.find('\n', prev)) != std::string::npos) {
      auto line = help_view.substr(prev, pos - prev + 1);
      if (first_line) {
        stream << hspace << line;
        first_line = false;
      } else {
        stream.width(stream_width);
        stream << name_padding << hspace << line;
      }
      prev += pos - prev + 1;
    }
    if (first_line) {
      stream << hspace << argument.m_help;
    } else {
      auto leftover = help_view.substr(prev, argument.m_help.size() - prev);
      if (!leftover.empty()) {
        stream.width(stream_width);
        stream << name_padding << hspace << leftover;
      }
    }

    // print nargs spec
    if (!argument.m_help.empty()) {
      stream << " ";
    }
    stream << argument.m_num_args_range;

    if (argument.m_default_value.has_value() &&
        argument.m_num_args_range != NArgsRange{0, 0}) {
      stream << "[default: " << argument.m_default_value_repr << "]";
    } else if (argument.m_is_required) {
      stream << "[required]";
    }
    stream << "\n";
    return stream;
  }